

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

void cut_objects_internal(Am_Object *cmd,Am_Value *new_sel)

{
  Am_Value *list_value;
  Am_Value_List selected_objs;
  Am_Object AStack_48;
  Am_Value_List local_40;
  Am_Value_List local_30;
  Am_Value local_20;
  
  Am_Value_List::Am_Value_List(&local_40);
  Am_Value::Am_Value(&local_20,new_sel);
  delete_objects_internal(cmd,&local_20);
  Am_Value::~Am_Value(&local_20);
  list_value = Am_Object::Get(cmd,0x16d,0);
  Am_Value_List::operator=(&local_40,list_value);
  Am_Object::Am_Object(&AStack_48,cmd);
  Am_Value_List::Am_Value_List(&local_30,&local_40);
  copy_objects_into_clipboard(&AStack_48,&local_30);
  Am_Value_List::~Am_Value_List(&local_30);
  Am_Object::~Am_Object(&AStack_48);
  Am_Value_List::~Am_Value_List(&local_40);
  return;
}

Assistant:

void
cut_objects_internal(Am_Object &cmd, Am_Value new_sel)
{
  Am_Value_List selected_objs;
  delete_objects_internal(cmd, new_sel); //delete the objects from the screen
  selected_objs = cmd.Get(Am_OBJECT_MODIFIED); //set by delete_objects_proc
  copy_objects_into_clipboard(cmd, selected_objs);
}